

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O1

ZyanStatus
ZydisFormatterIntelFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanBool ZVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  ZydisDecodedOperand *pZVar6;
  void *pvVar7;
  ZyanStatus ZVar8;
  ZyanStatus ZVar9;
  ZyanStatus ZVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  ZydisFormatterFunc *pp_Var14;
  ZyanUSize ZVar15;
  long lVar16;
  void *state;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x30,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x31,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x32,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x33,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x34,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar8 = (*formatter->func_print_prefixes)(formatter,buffer,context);
  ZVar9 = ZVar8;
  if ((-1 < (int)ZVar8) &&
     (ZVar9 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar9)) {
    if (buffer->is_token_list == '\0') {
      pvVar11 = (void *)(buffer->string).vector.size;
    }
    else {
      pvVar11 = (buffer->string).vector.data;
    }
    if (context->instruction->operand_count_visible != '\0') {
      lVar17 = 0;
      uVar18 = 0;
      do {
        pZVar6 = context->operands;
        if (((lVar17 != 0x50) || (pZVar6[1].type != ZYDIS_OPERAND_TYPE_REGISTER)) ||
           (bVar19 = false, pZVar6[1].encoding != ZYDIS_OPERAND_ENCODING_MASK)) {
          ZVar2 = buffer->is_token_list;
          if (ZVar2 == '\0') {
            state = (void *)(buffer->string).vector.size;
          }
          else {
            state = (buffer->string).vector.data;
          }
          if (state == pvVar11) {
            if (ZVar2 == '\0') {
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_001146ed:
                __assert_fail("!destination->vector.allocator",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xeb,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              ZVar15 = (buffer->string).vector.size;
              if (ZVar15 == 0) {
LAB_0011470c:
                __assert_fail("destination->vector.size && source->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xec,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              uVar13 = ZVar15 + 1;
              uVar12 = (buffer->string).vector.capacity;
              ZVar9 = 0x80100009;
              if (uVar13 <= uVar12) {
                *(undefined2 *)((long)(buffer->string).vector.data + (ZVar15 - 1)) = 0x20;
                ZVar15 = (buffer->string).vector.size;
                pvVar7 = (buffer->string).vector.data;
                (buffer->string).vector.size = ZVar15 + 1;
                cVar3 = *(char *)((long)pvVar7 + ZVar15);
LAB_0011434c:
                ZVar9 = ZVar8;
                if (cVar3 != '\0') {
                  __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                                ,0xf7,
                                "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                               );
                }
              }
              goto LAB_00114355;
            }
            ZVar15 = (buffer->string).vector.size;
            if (0xfe < ZVar15 - 1) {
LAB_001146ce:
              __assert_fail("(len > 0) && (len < 256)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                            ,0xe7,
                            "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                           );
            }
            uVar12 = buffer->capacity;
            uVar13 = ZVar15 + 4;
            ZVar9 = 0x80100009;
            if (uVar13 < uVar12) {
              pvVar7 = (buffer->string).vector.data;
              *(char *)((long)pvVar7 + -1) = (char)ZVar15;
              *(undefined4 *)((long)pvVar7 + ZVar15) = 0x200001;
              lVar16 = ZVar15 + 2;
LAB_0011426c:
              ZVar15 = buffer->capacity - lVar16;
              buffer->capacity = ZVar15;
              ppvVar1 = &(buffer->string).vector.data;
              *ppvVar1 = (void *)((long)*ppvVar1 + lVar16);
              (buffer->string).vector.size = 2;
              if (0xfe < ZVar15) {
                ZVar15 = 0xff;
              }
              (buffer->string).vector.capacity = ZVar15;
              ZVar9 = ZVar8;
            }
LAB_00114297:
            bVar19 = true;
            ZVar8 = ZVar9;
            if (uVar12 <= uVar13) goto LAB_00114410;
          }
          else {
            if (ZVar2 != '\0') {
              ZVar15 = (buffer->string).vector.size;
              if (0xfe < ZVar15 - 1) goto LAB_001146ce;
              uVar12 = buffer->capacity;
              uVar13 = ZVar15 + 8;
              ZVar9 = 0x80100009;
              if (uVar13 < uVar12) {
                pvVar7 = (buffer->string).vector.data;
                *(char *)((long)pvVar7 + -1) = (char)ZVar15;
                *(undefined8 *)((long)pvVar7 + ZVar15) = 0x200001002c0202;
                lVar16 = ZVar15 + 6;
                goto LAB_0011426c;
              }
              goto LAB_00114297;
            }
            if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_001146ed;
            ZVar15 = (buffer->string).vector.size;
            if (ZVar15 == 0) goto LAB_0011470c;
            uVar13 = ZVar15 + 2;
            uVar12 = (buffer->string).vector.capacity;
            ZVar9 = 0x80100009;
            if (uVar13 <= uVar12) {
              pvVar7 = (buffer->string).vector.data;
              *(undefined1 *)((long)pvVar7 + ZVar15 + 1) = 0;
              *(undefined2 *)((long)pvVar7 + (ZVar15 - 1)) = 0x202c;
              ZVar15 = (buffer->string).vector.size;
              pvVar7 = (buffer->string).vector.data;
              (buffer->string).vector.size = ZVar15 + 2;
              cVar3 = *(char *)((long)pvVar7 + ZVar15 + 1);
              goto LAB_0011434c;
            }
LAB_00114355:
            bVar19 = true;
            ZVar8 = ZVar9;
            if (uVar12 < uVar13) goto LAB_00114410;
          }
          context->operand = (ZydisDecodedOperand *)(&pZVar6->id + lVar17);
          if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_0011439f:
            pp_Var14 = &formatter->func_format_operand_reg;
            switch(*(undefined4 *)((long)&pZVar6->type + lVar17)) {
            case 1:
              break;
            case 2:
              pp_Var14 = &formatter->func_format_operand_mem;
              break;
            case 3:
              pp_Var14 = &formatter->func_format_operand_ptr;
              break;
            case 4:
              pp_Var14 = &formatter->func_format_operand_imm;
              break;
            default:
              bVar19 = true;
              ZVar8 = 0x80100004;
              goto LAB_00114410;
            }
            ZVar8 = (**pp_Var14)(formatter,buffer,context);
            if (ZVar8 == 0x20000b) {
LAB_001143e3:
              ZVar10 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)state);
              bVar19 = (int)ZVar10 < 0;
              ZVar8 = ZVar9;
              if (bVar19) {
                ZVar8 = ZVar10;
              }
            }
            else {
              if ((int)ZVar8 < 0) {
                bVar19 = true;
                goto LAB_00114410;
              }
              if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
                ZVar8 = (*formatter->func_post_operand)(formatter,buffer,context);
                if (ZVar8 == 0x20000b) goto LAB_001143e3;
                if (-1 < (int)ZVar8) goto LAB_00114469;
              }
              if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) !=
                  ZYDIS_INSTRUCTION_ENCODING_EVEX) goto LAB_00114590;
              if (((lVar17 == 0) && (1 < context->instruction->operand_count_visible)) &&
                 (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK)) {
                bVar19 = true;
                ZVar8 = (*formatter->func_print_decorator)
                                  (formatter,buffer,context,ZYDIS_DECORATOR_MASK);
                if ((int)ZVar8 < 0) goto LAB_00114410;
              }
              iVar5 = *(int *)((long)&pZVar6->type + lVar17);
              if (iVar5 == 2) {
                ZVar8 = (*formatter->func_print_decorator)
                                  (formatter,buffer,context,ZYDIS_DECORATOR_BC);
                if ((int)ZVar8 < 0) {
                  bVar19 = true;
                }
                else {
                  if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
                  goto LAB_00114590;
                  ZVar8 = (*formatter->func_print_decorator)
                                    (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
                  if ((int)ZVar8 < 0) {
                    bVar19 = true;
                  }
                  else {
                    ZVar8 = (*formatter->func_print_decorator)
                                      (formatter,buffer,context,ZYDIS_DECORATOR_EH);
                    bVar19 = true;
                    if (-1 < (int)ZVar8) goto LAB_00114590;
                  }
                }
              }
              else {
                bVar4 = context->instruction->operand_count_visible;
                if (uVar18 == bVar4 - 1) {
                  bVar19 = iVar5 != 4;
LAB_001145af:
                  bVar20 = true;
                  if (bVar19) {
LAB_001145da:
                    if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                       (ZVar8 = (*formatter->func_print_decorator)
                                          (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                       (int)ZVar8 < 0)) {
                      bVar20 = false;
                      ZVar9 = ZVar8;
                    }
                    else {
                      ZVar8 = (*formatter->func_print_decorator)
                                        (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                      if ((int)ZVar8 < 0) {
                        bVar20 = false;
                        ZVar9 = ZVar8;
                      }
                      else {
                        ZVar8 = (*formatter->func_print_decorator)
                                          (formatter,buffer,context,ZYDIS_DECORATOR_SAE);
                        bVar20 = -1 < (int)ZVar8;
                        if (!bVar20) {
                          ZVar9 = ZVar8;
                        }
                      }
                    }
                  }
                }
                else {
                  bVar20 = true;
                  if (uVar18 + 1 < (ulong)bVar4) {
                    if (*(int *)((long)&context->operands[1].type + lVar17) != 4) {
                      bVar19 = *(int *)((long)&context->operands[1].visibility + lVar17) == 3;
                      goto LAB_001145af;
                    }
                    goto LAB_001145da;
                  }
                }
                bVar19 = true;
                ZVar8 = ZVar9;
                if (bVar20) {
LAB_00114590:
                  bVar19 = false;
                  ZVar8 = ZVar9;
                }
              }
            }
          }
          else {
            ZVar8 = (*formatter->func_pre_operand)(formatter,buffer,context);
            if (ZVar8 == 0x20000b) goto LAB_001143e3;
            if (-1 < (int)ZVar8) goto LAB_0011439f;
LAB_00114469:
            bVar19 = true;
          }
        }
LAB_00114410:
        if (bVar19) {
          return ZVar8;
        }
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x50;
      } while (uVar18 < context->instruction->operand_count_visible);
    }
    ZVar9 = 0x100000;
  }
  return ZVar9;
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) &&
                 (context->instruction->operand_count_visible > 1) &&
                 (context->operands[i + 1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}